

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O2

void duckdb::LeastGreatestFunction<duckdb::string_t,duckdb::LessThan,duckdb::SortKeyLeastGreatest>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  undefined8 *puVar1;
  string_t *psVar2;
  bool bVar3;
  DataChunk *this;
  Vector *pVVar4;
  reference pvVar5;
  ulong uVar6;
  long lVar7;
  string_t *psVar8;
  idx_t col_idx;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  string_t ivalue;
  UnifiedVectorFormat vdata;
  long local_878;
  long local_870;
  bool result_has_value [2048];
  
  if (*(long *)(args + 8) - *(long *)args == 0x68) {
    vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
    duckdb::Vector::Reference(result);
    return;
  }
  this = SortKeyLeastGreatest::Prepare(args,state);
  pVVar4 = SortKeyLeastGreatest::TargetVector(result,state);
  uVar9 = 0;
  while( true ) {
    lVar7 = *(long *)this;
    lVar11 = *(long *)(this + 8);
    if ((ulong)((lVar11 - lVar7) / 0x68) <= uVar9) break;
    vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,uVar9);
    uVar9 = uVar9 + 1;
  }
  psVar2 = *(string_t **)(pVVar4 + 0x20);
  uVar9 = 0;
  memset(result_has_value,0,0x800);
  do {
    if ((ulong)((lVar11 - lVar7) / 0x68) <= uVar9) {
      SortKeyLeastGreatest::FinalizeResult(*(idx_t *)(this + 0x18),result_has_value,result,state);
      duckdb::Vector::SetVectorType((VectorType)result);
      return;
    }
    pvVar5 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this,uVar9);
    if (*pvVar5 == (value_type)0x2) {
      pvVar5 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this,uVar9);
      if ((*(byte **)(pvVar5 + 0x28) == (byte *)0x0) || ((**(byte **)(pvVar5 + 0x28) & 1) != 0))
      goto LAB_0071022c;
    }
    else {
LAB_0071022c:
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
      pvVar5 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this,uVar9);
      duckdb::Vector::ToUnifiedFormat((ulong)pvVar5,*(UnifiedVectorFormat **)(this + 0x18));
      if (local_870 == 0) {
        psVar8 = psVar2;
        for (uVar10 = 0; uVar10 < *(ulong *)(this + 0x18); uVar10 = uVar10 + 1) {
          uVar6 = uVar10;
          if (*_vdata != 0) {
            uVar6 = (ulong)*(uint *)(*_vdata + uVar10 * 4);
          }
          puVar1 = (undefined8 *)(local_878 + uVar6 * 0x10);
          ivalue.value._0_8_ = *puVar1;
          ivalue.value.pointer.ptr = (char *)puVar1[1];
          if ((result_has_value[uVar10] != true) ||
             (bVar3 = string_t::StringComparisonOperators::GreaterThan(psVar8,&ivalue), bVar3)) {
            result_has_value[uVar10] = true;
            *(undefined8 *)&psVar8->value = ivalue.value._0_8_;
            (psVar8->value).pointer.ptr = ivalue.value.pointer.ptr;
          }
          psVar8 = psVar8 + 1;
        }
      }
      else {
        psVar8 = psVar2;
        for (uVar10 = 0; uVar10 < *(ulong *)(this + 0x18); uVar10 = uVar10 + 1) {
          uVar6 = uVar10;
          if (*_vdata != 0) {
            uVar6 = (ulong)*(uint *)(*_vdata + uVar10 * 4);
          }
          if ((local_870 == 0) ||
             ((*(ulong *)(local_870 + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f) & 1) != 0)) {
            puVar1 = (undefined8 *)(local_878 + uVar6 * 0x10);
            ivalue.value._0_8_ = *puVar1;
            ivalue.value.pointer.ptr = (char *)puVar1[1];
            if ((result_has_value[uVar10] != true) ||
               (bVar3 = string_t::StringComparisonOperators::GreaterThan(psVar8,&ivalue), bVar3)) {
              result_has_value[uVar10] = true;
              *(undefined8 *)&psVar8->value = ivalue.value._0_8_;
              (psVar8->value).pointer.ptr = ivalue.value.pointer.ptr;
            }
          }
          psVar8 = psVar8 + 1;
        }
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&vdata);
    }
    uVar9 = uVar9 + 1;
    lVar7 = *(long *)this;
    lVar11 = *(long *)(this + 8);
  } while( true );
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}